

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O0

_Bool store_sell(store_context *ctx)

{
  store *store_00;
  _Bool _Var1;
  wchar_t amt_00;
  wchar_t wVar2;
  char *pcVar3;
  command *pcVar4;
  char *pcStack_210;
  int32_t price;
  char *prompt;
  char *reject;
  item_tester tester;
  char o_name [120];
  object *temp_obj;
  object object_type_body;
  object *obj;
  store *store;
  wchar_t get_mode;
  wchar_t amt;
  store_context *ctx_local;
  
  store._0_4_ = L'\x0f';
  store_00 = ctx->store;
  memcpy(&temp_obj,&DAT_002bdeb8,0x148);
  o_name._112_8_ = &temp_obj;
  reject = (char *)0x0;
  pcStack_210 = "Sell which item? ";
  if (((player->opts).opt[0x25] & 1U) != 0) {
    pcStack_210 = "Give which item? ";
  }
  if (store_00 == (store *)0x0) {
    __assert_fail("store",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-store.c"
                  ,0x1f8,"_Bool store_sell(struct store_context *)");
  }
  msg_flag = false;
  prt("",L'\0',L'\0');
  _Var1 = store_is_home(store_00);
  if (_Var1) {
    pcStack_210 = "Drop which item? ";
  }
  else {
    reject = (char *)store_will_buy_tester;
    store._0_4_ = L'/';
  }
  player->upkeep->command_wrk = L'\x02';
  _Var1 = get_item((object **)&object_type_body.note,pcStack_210,"You have nothing that I want. ",
                   CMD_DROP,(item_tester)reject,(wchar_t)store);
  if (_Var1) {
    _Var1 = object_is_equipped(player->body,(object *)object_type_body.note);
    if ((!_Var1) || (_Var1 = obj_can_takeoff((object *)object_type_body.note), _Var1)) {
      amt_00 = get_quantity((char *)0x0,(uint)*(byte *)(object_type_body.note + 0x12a));
      if (amt_00 < L'\x01') {
        ctx_local._7_1_ = false;
      }
      else {
        object_copy_amt((object *)o_name._112_8_,(object *)object_type_body.note,amt_00);
        _Var1 = store_check_num(store_00,(object *)o_name._112_8_);
        if (_Var1) {
          object_desc((char *)&tester,0x78,(object *)o_name._112_8_,0x43,player);
          _Var1 = store_is_home(store_00);
          if (_Var1) {
            object_wipe((object *)o_name._112_8_);
            cmdq_push(CMD_STASH);
            pcVar4 = cmdq_peek();
            cmd_set_arg_item(pcVar4,"item",(object *)object_type_body.note);
            pcVar4 = cmdq_peek();
            cmd_set_arg_number(pcVar4,"quantity",amt_00);
          }
          else {
            wVar2 = price_item(store_00,(object *)o_name._112_8_,true,amt_00);
            object_wipe((object *)o_name._112_8_);
            screen_save();
            if (((player->opts).opt[0x25] & 1U) == 0) {
              pcVar3 = format("Price: %ld",(long)wVar2);
              prt(pcVar3,L'\x01',L'\0');
            }
            pcVar3 = "Sell";
            if (((player->opts).opt[0x25] & 1U) != 0) {
              pcVar3 = "Give";
            }
            pcVar3 = format("%s %s? [ESC, any other key to accept]",pcVar3,&tester);
            _Var1 = store_get_check(pcVar3);
            if (!_Var1) {
              screen_load();
              return false;
            }
            screen_load();
            cmdq_push(CMD_SELL);
            pcVar4 = cmdq_peek();
            cmd_set_arg_item(pcVar4,"item",(object *)object_type_body.note);
            pcVar4 = cmdq_peek();
            cmd_set_arg_number(pcVar4,"quantity",amt_00);
          }
          ctx->flags = ctx->flags | 1;
          ctx_local._7_1_ = true;
        }
        else {
          object_wipe((object *)o_name._112_8_);
          _Var1 = store_is_home(store_00);
          if (_Var1) {
            msg("Your home is full.");
          }
          else {
            msg("I have not the room in my store to keep it.");
          }
          ctx_local._7_1_ = false;
        }
      }
    }
    else {
      msg("Hmmm, it seems to be stuck.");
      ctx_local._7_1_ = false;
    }
  }
  else {
    ctx_local._7_1_ = false;
  }
  return ctx_local._7_1_;
}

Assistant:

static bool store_sell(struct store_context *ctx)
{
	int amt;
	int get_mode = USE_EQUIP | USE_INVEN | USE_FLOOR | USE_QUIVER;

	struct store *store = ctx->store;

	struct object *obj;
	struct object object_type_body = OBJECT_NULL;
	struct object *temp_obj = &object_type_body;

	char o_name[120];

	item_tester tester = NULL;

	const char *reject = "You have nothing that I want. ";
	const char *prompt = OPT(player, birth_no_selling) ? "Give which item? " : "Sell which item? ";

	assert(store);

	/* Clear all current messages */
	msg_flag = false;
	prt("", 0, 0);

	if (store_is_home(store)) {
		prompt = "Drop which item? ";
	} else {
		tester = store_will_buy_tester;
		get_mode |= SHOW_PRICES;
	}

	/* Get an item */
	player->upkeep->command_wrk = USE_INVEN;

	if (!get_item(&obj, prompt, reject, CMD_DROP, tester, get_mode))
		return false;

	/* Cannot remove stickied objects */
	if (object_is_equipped(player->body, obj) && !obj_can_takeoff(obj)) {
		/* Oops */
		msg("Hmmm, it seems to be stuck.");

		/* Nope */
		return false;
	}

	/* Get a quantity */
	amt = get_quantity(NULL, obj->number);

	/* Allow user abort */
	if (amt <= 0) return false;

	/* Get a copy of the object representing the number being sold */
	object_copy_amt(temp_obj, obj, amt);

	if (!store_check_num(store, temp_obj)) {
		object_wipe(temp_obj);
		if (store_is_home(store))
			msg("Your home is full.");
		else
			msg("I have not the room in my store to keep it.");

		return false;
	}

	/* Get a full description */
	object_desc(o_name, sizeof(o_name), temp_obj,
		ODESC_PREFIX | ODESC_FULL, player);

	/* Real store */
	if (!store_is_home(store)) {
		/* Extract the value of the items */
		int32_t price = price_item(store, temp_obj, true, amt);

		object_wipe(temp_obj);
		screen_save();

		/* Show price */
		if (!OPT(player, birth_no_selling))
			prt(format("Price: %ld", (long)price), 1, 0);

		/* Confirm sale */
		if (!store_get_check(format("%s %s? [ESC, any other key to accept]",
				OPT(player, birth_no_selling) ? "Give" : "Sell", o_name))) {
			screen_load();
			return false;
		}

		screen_load();

		cmdq_push(CMD_SELL);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
		cmd_set_arg_number(cmdq_peek(), "quantity", amt);
	} else { /* Player is at home */
		object_wipe(temp_obj);
		cmdq_push(CMD_STASH);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
		cmd_set_arg_number(cmdq_peek(), "quantity", amt);
	}

	/* Update the display */
	ctx->flags |= STORE_GOLD_CHANGE;

	return true;
}